

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxUnaryNotBitwise::Emit(FxUnaryNotBitwise *this,VMFunctionBuilder *build)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (*(this->Operand->ValueType->super_DObject)._vptr_DObject[0x12])();
  if (iVar1 != 0) {
    __assert_fail("Operand->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x36d,"virtual ExpEmit FxUnaryNotBitwise::Emit(VMFunctionBuilder *)");
  }
  uVar2 = (*this->Operand->_vptr_FxExpression[7])(this->Operand,build);
  if ((uVar2 >> 0x10 & 1) == 0) {
    VMFunctionBuilder::Emit(build,0x6d,uVar2 & 0xff,uVar2 & 0xff,0);
    return SUB43(uVar2,0);
  }
  __assert_fail("!from.Konst",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x36f,"virtual ExpEmit FxUnaryNotBitwise::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxUnaryNotBitwise::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType->GetRegType() == REGT_INT);
	ExpEmit from = Operand->Emit(build);
	assert(!from.Konst);
	// Do it in-place.
	build->Emit(OP_NOT, from.RegNum, from.RegNum, 0);
	return from;
}